

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O1

void __thiscall kratos::RemoveEmptyBlockVisitor::visit(RemoveEmptyBlockVisitor *this,Generator *top)

{
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *pvVar1;
  shared_ptr<kratos::Stmt> *psVar2;
  undefined8 uVar3;
  element_type *this_00;
  long lVar4;
  shared_ptr<kratos::Stmt> *stmt_1;
  undefined1 stmt_00 [8];
  long lVar5;
  undefined1 local_78 [16];
  undefined1 auStack_68 [8];
  vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  stmts_to_remove;
  undefined1 local_40 [8];
  shared_ptr<kratos::Stmt> stmt;
  
  auStack_68 = (undefined1  [8])0x0;
  stmts_to_remove.
  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  stmts_to_remove.
  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar4 = (long)(top->stmts_).
                super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(top->stmts_).
                super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  stmt_00 = auStack_68;
  psVar2 = stmts_to_remove.
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (lVar4 != 0) {
    lVar4 = lVar4 >> 4;
    lVar5 = 0;
    do {
      Generator::get_stmt((Generator *)local_40,(uint32_t)top);
      this_00 = stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      stmts_to_remove.
      super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_40;
      if (stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          pvVar1 = &((stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_IRNode).fn_name_ln;
          *(int *)&(pvVar1->
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_start =
               *(int *)&(pvVar1->
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + 1;
          UNLOCK();
        }
        else {
          pvVar1 = &((stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    super_IRNode).fn_name_ln;
          *(int *)&(pvVar1->
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_start =
               *(int *)&(pvVar1->
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + 1;
        }
      }
      dispatch_node((RemoveEmptyBlockVisitor *)local_78,(shared_ptr<kratos::Stmt> *)this);
      uVar3 = local_78._0_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
      }
      if (this_00 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
      }
      if ((_func_int **)uVar3 == (_func_int **)0x0) {
        std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>::
        emplace_back<std::shared_ptr<kratos::Stmt>&>
                  ((vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>
                    *)auStack_68,(shared_ptr<kratos::Stmt> *)local_40);
      }
      if (stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      lVar5 = lVar5 + 1;
      stmt_00 = auStack_68;
      psVar2 = stmts_to_remove.
               super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
  }
  for (; stmt_00 != (undefined1  [8])psVar2; stmt_00 = (undefined1  [8])((long)stmt_00 + 0x10)) {
    Generator::remove_stmt(top,(shared_ptr<kratos::Stmt> *)stmt_00);
  }
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
  ~vector((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *)
          auStack_68);
  return;
}

Assistant:

void visit(Generator* top) override {
        auto stmt_count = top->stmts_count();
        std::vector<std::shared_ptr<Stmt>> stmts_to_remove;
        for (uint64_t i = 0; i < stmt_count; i++) {
            auto stmt = top->get_stmt(i);
            if (!dispatch_node(stmt)) stmts_to_remove.emplace_back(stmt);
        }
        for (auto const& stmt : stmts_to_remove) {
            top->remove_stmt(stmt);
        }
    }